

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O3

bool __thiscall
chrono::utils::ChValidation::Process(ChValidation *this,Data *sim_data,Data *ref_data)

{
  Data *this_00;
  Data *this_01;
  ulong uVar1;
  double dVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer pbVar6;
  double *pdVar7;
  double *pdVar8;
  void *pvVar9;
  ostream *poVar10;
  ulong *puVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  size_type __new_size;
  void *pvVar15;
  char *pcVar16;
  long lVar17;
  long lVar18;
  size_t sVar19;
  size_t __s;
  long lVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_XMM3 [16];
  
  if ((this->m_L2_norms)._M_size != 0) {
    operator_delete((this->m_L2_norms)._M_data);
    (this->m_L2_norms)._M_size = 0;
    pdVar8 = (double *)::operator_new(0);
    (this->m_L2_norms)._M_data = pdVar8;
  }
  if ((this->m_RMS_norms)._M_size != 0) {
    operator_delete((this->m_RMS_norms)._M_data);
    (this->m_RMS_norms)._M_size = 0;
    pdVar8 = (double *)::operator_new(0);
    (this->m_RMS_norms)._M_data = pdVar8;
  }
  if ((this->m_INF_norms)._M_size != 0) {
    operator_delete((this->m_INF_norms)._M_data);
    (this->m_INF_norms)._M_size = 0;
    pdVar8 = (double *)::operator_new(0);
    (this->m_INF_norms)._M_data = pdVar8;
  }
  pvVar3 = (sim_data->
           super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (sim_data->
           super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  __new_size = (long)pvVar4 - (long)pvVar3 >> 4;
  this->m_num_cols = __new_size;
  if (pvVar4 == pvVar3) {
    pcVar16 = "ERROR: no values in simulation data structure.";
    lVar18 = 0x2e;
  }
  else {
    sVar19 = pvVar3->_M_size;
    this->m_num_rows = sVar19;
    pvVar5 = (ref_data->
             super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)pvVar4 - (long)pvVar3 !=
        (long)(ref_data->
              super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ERROR: the number of columns in the two structures is different:",0x40);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"   Simulation data has ",0x17);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      pcVar16 = " columns";
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," columns",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"   Reference data has ",0x16);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      lVar18 = 8;
      goto LAB_0092354c;
    }
    if (sVar19 != pvVar5->_M_size) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ERROR: the number of rows in the two structures is different:",0x3d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"   Simulation data has ",0x17);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      pcVar16 = " rows";
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," rows",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"   Reference data has ",0x16);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      lVar18 = 5;
      goto LAB_0092354c;
    }
    this_00 = &this->m_sim_data;
    std::vector<std::valarray<double>,_std::allocator<std::valarray<double>_>_>::resize
              (this_00,__new_size);
    this_01 = &this->m_ref_data;
    std::vector<std::valarray<double>,_std::allocator<std::valarray<double>_>_>::resize
              (this_01,this->m_num_cols);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->m_sim_headers,this->m_num_cols);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->m_ref_headers,this->m_num_cols);
    if (this->m_num_cols != 0) {
      lVar18 = 8;
      lVar20 = 0;
      uVar14 = 0;
      do {
        pvVar3 = (sim_data->
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (this_00->
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = *(long *)((long)pvVar4 + lVar18 + -8);
        lVar17 = *(long *)((long)pvVar3 + lVar18 + -8);
        if (lVar12 == lVar17) {
          if (lVar12 != 0) {
            pvVar9 = *(void **)((long)&pvVar4->_M_size + lVar18);
            pvVar15 = *(void **)((long)&pvVar3->_M_size + lVar18);
LAB_00923249:
            memcpy(pvVar9,pvVar15,lVar12 << 3);
          }
        }
        else {
          pvVar9 = *(void **)((long)&pvVar4->_M_size + lVar18);
          if (pvVar9 != (void *)0x0) {
            operator_delete(pvVar9);
            lVar17 = *(long *)((long)pvVar3 + lVar18 + -8);
          }
          *(long *)((long)pvVar4 + lVar18 + -8) = lVar17;
          pvVar9 = ::operator_new(lVar17 << 3);
          *(void **)((long)&pvVar4->_M_size + lVar18) = pvVar9;
          pvVar15 = *(void **)((long)&pvVar3->_M_size + lVar18);
          if (pvVar15 != (void *)0x0) {
            lVar12 = *(long *)((long)pvVar4 + lVar18 + -8);
            goto LAB_00923249;
          }
        }
        pvVar3 = (ref_data->
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (this_01->
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = *(long *)((long)pvVar4 + lVar18 + -8);
        lVar17 = *(long *)((long)pvVar3 + lVar18 + -8);
        if (lVar12 == lVar17) {
          if (lVar12 != 0) {
            pvVar9 = *(void **)((long)&pvVar4->_M_size + lVar18);
            pvVar15 = *(void **)((long)&pvVar3->_M_size + lVar18);
LAB_009232bb:
            memcpy(pvVar9,pvVar15,lVar12 << 3);
          }
        }
        else {
          pvVar9 = *(void **)((long)&pvVar4->_M_size + lVar18);
          if (pvVar9 != (void *)0x0) {
            operator_delete(pvVar9);
            lVar17 = *(long *)((long)pvVar3 + lVar18 + -8);
          }
          *(long *)((long)pvVar4 + lVar18 + -8) = lVar17;
          pvVar9 = ::operator_new(lVar17 << 3);
          *(void **)((long)&pvVar4->_M_size + lVar18) = pvVar9;
          pvVar15 = *(void **)((long)&pvVar3->_M_size + lVar18);
          if (pvVar15 != (void *)0x0) {
            lVar12 = *(long *)((long)pvVar4 + lVar18 + -8);
            goto LAB_009232bb;
          }
        }
        pbVar6 = (this->m_ref_headers).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::_M_replace
                  ((long)&(pbVar6->_M_dataplus)._M_p + lVar20,0,
                   *(char **)((long)pbVar6 + lVar18 * 2 + -8),0x9df7fa);
        uVar14 = uVar14 + 1;
        lVar18 = lVar18 + 0x10;
        lVar20 = lVar20 + 0x20;
      } while (uVar14 < this->m_num_cols);
    }
    pvVar3 = (this_00->
             super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    sVar19 = pvVar3->_M_size;
    pvVar4 = (this_01->
             super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pvVar9 = ::operator_new(sVar19 * 8);
    auVar22 = ZEXT816(0) << 0x40;
    if (sVar19 != 0) {
      pdVar8 = pvVar3->_M_data;
      pdVar7 = pvVar4->_M_data;
      sVar13 = 0;
      do {
        *(double *)((long)pvVar9 + sVar13 * 8) = pdVar8[sVar13] - pdVar7[sVar13];
        sVar13 = sVar13 + 1;
      } while (sVar19 != sVar13);
      dVar21 = *(double *)((long)pvVar9 + sVar19 * 8 + -8);
      dVar21 = dVar21 * dVar21;
      for (; auVar22._8_8_ = 0, auVar22._0_8_ = dVar21, sVar19 != 1; sVar19 = sVar19 - 1) {
        dVar2 = *(double *)((long)pvVar9 + sVar19 * 8 + -0x10);
        dVar21 = dVar21 + dVar2 * dVar2;
      }
    }
    if (auVar22._0_8_ < 0.0) {
      dVar21 = sqrt(auVar22._0_8_);
    }
    else {
      auVar22 = vsqrtsd_avx(auVar22,auVar22);
      dVar21 = auVar22._0_8_;
    }
    operator_delete(pvVar9);
    if (dVar21 <= 1e-10) {
      sVar13 = this->m_num_cols;
      pdVar8 = (this->m_L2_norms)._M_data;
      sVar19 = sVar13 - 1;
      if ((this->m_L2_norms)._M_size != sVar19) {
        operator_delete(pdVar8);
        (this->m_L2_norms)._M_size = sVar19;
        pdVar8 = (double *)::operator_new(sVar19 * 8);
        (this->m_L2_norms)._M_data = pdVar8;
      }
      if (sVar19 != 0) {
        memset(pdVar8,0,sVar13 * 8 - 8);
      }
      sVar13 = this->m_num_cols;
      pdVar8 = (this->m_RMS_norms)._M_data;
      sVar19 = sVar13 - 1;
      if ((this->m_RMS_norms)._M_size != sVar19) {
        operator_delete(pdVar8);
        (this->m_RMS_norms)._M_size = sVar19;
        pdVar8 = (double *)::operator_new(sVar19 * 8);
        (this->m_RMS_norms)._M_data = pdVar8;
      }
      if (sVar19 != 0) {
        memset(pdVar8,0,sVar13 * 8 - 8);
      }
      sVar13 = this->m_num_cols;
      pdVar8 = (this->m_INF_norms)._M_data;
      sVar19 = sVar13 - 1;
      if ((this->m_INF_norms)._M_size != sVar19) {
        operator_delete(pdVar8);
        (this->m_INF_norms)._M_size = sVar19;
        pdVar8 = (double *)::operator_new(sVar19 * 8);
        (this->m_INF_norms)._M_data = pdVar8;
      }
      if (sVar19 != 0) {
        memset(pdVar8,0,sVar13 * 8 - 8);
      }
      if (this->m_num_cols == 1) {
        return true;
      }
      uVar14 = 0;
      do {
        uVar1 = uVar14 + 1;
        pvVar3 = (this_00->
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar19 = pvVar3[uVar1]._M_size;
        pvVar4 = (this_01->
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar9 = ::operator_new(sVar19 * 8);
        auVar23 = ZEXT816(0) << 0x40;
        if (sVar19 != 0) {
          pdVar8 = pvVar4[uVar1]._M_data;
          sVar13 = 0;
          pdVar7 = pvVar3[uVar1]._M_data;
          do {
            *(double *)((long)pvVar9 + sVar13 * 8) = pdVar7[sVar13] - pdVar8[sVar13];
            sVar13 = sVar13 + 1;
          } while (sVar19 != sVar13);
          dVar21 = *(double *)((long)pvVar9 + sVar19 * 8 + -8);
          dVar21 = dVar21 * dVar21;
          for (; auVar23._8_8_ = 0, auVar23._0_8_ = dVar21, sVar19 != 1; sVar19 = sVar19 - 1) {
            dVar2 = *(double *)((long)pvVar9 + sVar19 * 8 + -0x10);
            dVar21 = dVar21 + dVar2 * dVar2;
          }
        }
        if (auVar23._0_8_ < 0.0) {
          dVar21 = sqrt(auVar23._0_8_);
        }
        else {
          auVar22 = vsqrtsd_avx(auVar23,auVar23);
          dVar21 = auVar22._0_8_;
        }
        (this->m_L2_norms)._M_data[uVar14] = dVar21;
        operator_delete(pvVar9);
        pvVar3 = (this->m_sim_data).
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (this->m_ref_data).
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar19 = pvVar3[uVar1]._M_size;
        pvVar9 = ::operator_new(sVar19 * 8);
        if (sVar19 == 0) {
          auVar24 = SUB6416(ZEXT864(0),0) << 0x40;
        }
        else {
          pdVar8 = pvVar4[uVar1]._M_data;
          sVar13 = 0;
          pdVar7 = pvVar3[uVar1]._M_data;
          do {
            *(double *)((long)pvVar9 + sVar13 * 8) = pdVar7[sVar13] - pdVar8[sVar13];
            sVar13 = sVar13 + 1;
          } while (sVar19 != sVar13);
          dVar21 = *(double *)((long)pvVar9 + sVar19 * 8 + -8);
          dVar21 = dVar21 * dVar21;
          for (sVar13 = sVar19; auVar24._8_8_ = 0, auVar24._0_8_ = dVar21, sVar13 != 1;
              sVar13 = sVar13 - 1) {
            dVar2 = *(double *)((long)pvVar9 + sVar13 * 8 + -0x10);
            dVar21 = dVar21 + dVar2 * dVar2;
          }
        }
        auVar22 = vcvtusi2sd_avx512f(in_XMM3,sVar19);
        auVar25._0_8_ = auVar24._0_8_ / auVar22._0_8_;
        auVar25._8_8_ = auVar24._8_8_;
        if (auVar25._0_8_ < 0.0) {
          dVar21 = sqrt(auVar25._0_8_);
        }
        else {
          auVar22 = vsqrtsd_avx(auVar25,auVar25);
          dVar21 = auVar22._0_8_;
        }
        (this->m_RMS_norms)._M_data[uVar14] = dVar21;
        operator_delete(pvVar9);
        pvVar3 = (this->m_sim_data).
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (this->m_ref_data).
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar19 = pvVar3[uVar1]._M_size;
        puVar11 = (ulong *)::operator_new(sVar19 * 8);
        if (sVar19 == 0) {
          dVar21 = 0.0;
        }
        else {
          auVar28._8_8_ = 0x7fffffffffffffff;
          auVar28._0_8_ = 0x7fffffffffffffff;
          pdVar8 = pvVar4[uVar1]._M_data;
          sVar13 = 0;
          pdVar7 = pvVar3[uVar1]._M_data;
          do {
            puVar11[sVar13] = (ulong)(pdVar7[sVar13] - pdVar8[sVar13]);
            sVar13 = sVar13 + 1;
          } while (sVar19 != sVar13);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *puVar11;
          auVar22 = vandpd_avx(auVar26,auVar28);
          dVar21 = auVar22._0_8_;
          if (sVar19 != 1) {
            sVar13 = 1;
            do {
              auVar27._8_8_ = 0;
              auVar27._0_8_ = puVar11[sVar13];
              sVar13 = sVar13 + 1;
              auVar23 = vandpd_avx(auVar27,auVar28);
              auVar22 = vmaxsd_avx(auVar23,auVar22);
              dVar21 = auVar22._0_8_;
            } while (sVar19 != sVar13);
          }
        }
        (this->m_INF_norms)._M_data[uVar14] = dVar21;
        operator_delete(puVar11);
        uVar14 = uVar1;
      } while (uVar1 < this->m_num_cols - 1);
      return true;
    }
    pcVar16 = "ERROR: time sequences do not match.";
    lVar18 = 0x23;
  }
  poVar10 = (ostream *)&std::cout;
LAB_0092354c:
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar16,lVar18);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  return false;
}

Assistant:

bool ChValidation::Process(const Data& sim_data, const Data& ref_data) {
    // Resize the arrays of norms to zero length
    // (needed if we return with an error below)
    m_L2_norms.resize(0);
    m_RMS_norms.resize(0);
    m_INF_norms.resize(0);

    // Read the simulation results file.
    m_num_cols = sim_data.size();
    if (m_num_cols < 1) {
        std::cout << "ERROR: no values in simulation data structure." << std::endl;
        return false;
    }

    m_num_rows = sim_data[0].size();

    // Perform some sanity checks.
    if (m_num_cols != ref_data.size()) {
        std::cout << "ERROR: the number of columns in the two structures is different:" << std::endl;
        std::cout << "   Simulation data has " << m_num_cols << " columns" << std::endl;
        std::cout << "   Reference data has " << ref_data.size() << " columns" << std::endl;
        return false;
    }

    if (m_num_rows != ref_data[0].size()) {
        std::cout << "ERROR: the number of rows in the two structures is different:" << std::endl;
        std::cout << "   Simulation data has " << m_num_rows << " rows" << std::endl;
        std::cout << "   Reference data has " << ref_data[0].size() << " rows" << std::endl;
        return false;
    }

    // Cache simulation and reference data. Set headers to empty values.
    m_sim_data.resize(m_num_cols);
    m_ref_data.resize(m_num_cols);
    m_sim_headers.resize(m_num_cols);
    m_ref_headers.resize(m_num_cols);
    for (size_t col = 0; col < m_num_cols; col++) {
        m_sim_data[col] = sim_data[col];
        m_ref_data[col] = ref_data[col];
        m_ref_headers[col] = "";
    }

    // Ensure that the first columns (time) are the same.
    if (L2norm(m_sim_data[0] - m_ref_data[0]) > 1e-10) {
        std::cout << "ERROR: time sequences do not match." << std::endl;
        return false;
    }

    // Resize arrays of norms.
    m_L2_norms.resize(m_num_cols - 1);
    m_RMS_norms.resize(m_num_cols - 1);
    m_INF_norms.resize(m_num_cols - 1);

    // Calculate norms of the differences.
    for (size_t col = 0; col < m_num_cols - 1; col++) {
        m_L2_norms[col] = L2norm(m_sim_data[col + 1] - m_ref_data[col + 1]);
        m_RMS_norms[col] = RMSnorm(m_sim_data[col + 1] - m_ref_data[col + 1]);
        m_INF_norms[col] = INFnorm(m_sim_data[col + 1] - m_ref_data[col + 1]);
    }

    return true;
}